

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_52dd::TlbExportVisitor::visit_(TlbExportVisitor *this,Array *type)

{
  ostream *poVar1;
  Type *type_00;
  string sStack_48;
  
  std::operator<<(this->m_stream,"<array ");
  indirect(this->m_stream,(Indirect *)type);
  poVar1 = std::operator<<(this->m_stream," dimension=\"");
  Typelib::Array::getDimension();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\" ");
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(&sStack_48,this);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_48);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)&sStack_48);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_(&sStack_48,type,type_00);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_48);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&sStack_48);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  std::operator<<(poVar1,"</array>");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_ (Array const& type)
    {
        m_stream << "<array ";
        indirect(m_stream, type);
        m_stream << " dimension=\"" << type.getDimension() << "\" " << emitSourceID() << ">\n";
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</array>";
        return true;
    }